

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::operator==(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *this,GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *rhs)

{
  uint uVar1;
  Token *pTVar2;
  Token *pTVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  
  if ((rhs->parseErrorCode_ == kPointerParseErrorNone &&
       this->parseErrorCode_ == kPointerParseErrorNone) &&
     (sVar7 = this->tokenCount_, sVar7 == rhs->tokenCount_)) {
    bVar5 = true;
    if (sVar7 != 0) {
      pTVar2 = this->tokens_;
      pTVar3 = rhs->tokens_;
      lVar6 = 0xc;
      do {
        if (((*(int *)((long)&pTVar2->name + lVar6) != *(int *)((long)&pTVar3->name + lVar6)) ||
            (uVar1 = *(uint *)((long)pTVar2 + lVar6 + -4),
            uVar1 != *(uint *)((long)pTVar3 + lVar6 + -4))) ||
           (((ulong)uVar1 != 0 &&
            (iVar4 = bcmp(*(void **)((long)pTVar2 + lVar6 + -0xc),
                          *(void **)((long)pTVar3 + lVar6 + -0xc),(ulong)uVar1), iVar4 != 0))))
        goto LAB_00140de9;
        lVar6 = lVar6 + 0x10;
        sVar7 = sVar7 - 1;
      } while (sVar7 != 0);
    }
  }
  else {
LAB_00140de9:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator==(const GenericPointer& rhs) const {
        if (!IsValid() || !rhs.IsValid() || tokenCount_ != rhs.tokenCount_)
            return false;

        for (size_t i = 0; i < tokenCount_; i++) {
            if (tokens_[i].index != rhs.tokens_[i].index ||
                tokens_[i].length != rhs.tokens_[i].length || 
                (tokens_[i].length != 0 && std::memcmp(tokens_[i].name, rhs.tokens_[i].name, sizeof(Ch)* tokens_[i].length) != 0))
            {
                return false;
            }
        }

        return true;
    }